

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

MSize lj_tab_len_hint(GCtab *t,size_t hint)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  cTValue *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar2 = (t->array).ptr64;
  if (hint + 1 < (ulong)t->asize) {
    if ((*(long *)(uVar2 + hint * 8) != -1) && (*(long *)(uVar2 + 8 + hint * 8) == -1)) {
LAB_0011107a:
      return (MSize)hint;
    }
  }
  else if (((hint + 1 <= (ulong)t->asize) && (t->hmask == 0)) && (*(long *)(uVar2 + hint * 8) != -1)
          ) goto LAB_0011107a;
  uVar5 = (ulong)t->asize - 1;
  if ((ulong)t->asize == 0) {
    uVar5 = 0;
  }
  if ((uVar5 == 0) || (uVar2 = (t->array).ptr64, *(long *)(uVar2 + uVar5 * 8) != -1)) {
    if (t->hmask != 0) {
      uVar1 = t->asize;
      uVar3 = uVar5 + 1;
      do {
        uVar7 = uVar3;
        uVar6 = (uint)uVar7;
        if (uVar6 < uVar1) {
          pcVar4 = (cTValue *)((long)(int)uVar6 * 8 + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar6);
        }
        if ((pcVar4 == (cTValue *)0x0) || (pcVar4->u64 == 0xffffffffffffffff)) goto LAB_00110ff7;
        uVar3 = uVar7 * 2;
        uVar5 = uVar7;
      } while (uVar7 < 0x3fffffff);
      uVar6 = 0;
      lVar8 = 0x100000000;
      do {
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        if (uVar6 < uVar1) {
          pcVar4 = (cTValue *)((lVar8 >> 0x1d) + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar6);
        }
      } while ((pcVar4 != (cTValue *)0x0) &&
              (lVar8 = lVar8 + 0x100000000, pcVar4->u64 != 0xffffffffffffffff));
      goto LAB_00110fdf;
    }
    uVar3 = uVar5 & 0xffffffff;
  }
  else {
    uVar3 = 0;
    while (uVar7 = uVar5, 1 < uVar7 - uVar3) {
      uVar5 = uVar3 + uVar7 >> 1;
      if (*(long *)(uVar2 + uVar5 * 8) != -1) {
        uVar3 = uVar5;
        uVar5 = uVar7;
      }
    }
  }
  return (MSize)uVar3;
LAB_00110ff7:
  while (uVar3 = uVar7, 1 < uVar3 - uVar5) {
    uVar9 = uVar3 + uVar5 >> 1;
    uVar6 = (uint)uVar9;
    if (uVar6 < uVar1) {
      pcVar4 = (cTValue *)((long)(int)uVar6 * 8 + (t->array).ptr64);
    }
    else {
      pcVar4 = lj_tab_getinth(t,uVar6);
    }
    uVar7 = uVar9;
    if ((pcVar4 != (cTValue *)0x0) && (pcVar4->u64 != 0xffffffffffffffff)) {
      uVar7 = uVar3;
      uVar5 = uVar9;
    }
  }
LAB_00110fdf:
  return (MSize)uVar5;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len_hint(GCtab *t, size_t hint)
{
  size_t asize = (size_t)t->asize;
  cTValue *tv = arrayslot(t, hint);
  if (LJ_LIKELY(hint+1 < asize)) {
    if (LJ_LIKELY(!tvisnil(tv) && tvisnil(tv+1))) return (MSize)hint;
  } else if (hint+1 <= asize && LJ_LIKELY(t->hmask == 0) && !tvisnil(tv)) {
    return (MSize)hint;
  }
  return lj_tab_len(t);
}